

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCGeometryCollider.cpp
# Opt level: O2

int chrono::collision::ChGeometryCollider::ComputeCollisions
              (ChGeometry *mgeo1,ChMatrix33<double> *R1,Vector *T1,ChGeometry *mgeo2,
              ChMatrix33<double> *R2,Vector *T2,ChNarrowPhaseCollider *mcollider,
              ChMatrix33<double> *relRot,Vector *relPos,bool just_intersection)

{
  int iVar1;
  ChTriangle *pCVar2;
  ChBox *mgeo2_00;
  Vector *pVVar3;
  ChBox *mbox1;
  ChMatrix33<double> *R1_00;
  ChBox *mbox2;
  bool bVar4;
  
  iVar1 = (*mgeo1->_vptr_ChGeometry[3])();
  if ((iVar1 == 4) && (iVar1 = (*mgeo2->_vptr_ChGeometry[3])(mgeo2), iVar1 == 4)) {
LAB_00d7fa64:
    iVar1 = 0;
  }
  else {
    iVar1 = (*mgeo1->_vptr_ChGeometry[3])(mgeo1);
    if ((iVar1 == 1) && (iVar1 = (*mgeo2->_vptr_ChGeometry[3])(mgeo2), iVar1 == 1)) {
      iVar1 = ComputeSphereSphereCollisions
                        ((ChSphere *)mgeo1,T1,(ChSphere *)mgeo2,T2,mcollider,just_intersection);
      return iVar1;
    }
    iVar1 = (*mgeo1->_vptr_ChGeometry[3])(mgeo1);
    if ((iVar1 == 2) && (iVar1 = (*mgeo2->_vptr_ChGeometry[3])(mgeo2), iVar1 == 2)) {
      iVar1 = ComputeBoxBoxCollisions
                        ((ChBox *)mgeo1,R1,T1,(ChBox *)mgeo2,R2,T2,mcollider,just_intersection);
      return iVar1;
    }
    iVar1 = (*mgeo1->_vptr_ChGeometry[3])(mgeo1);
    if ((iVar1 == 1) && (iVar1 = (*mgeo2->_vptr_ChGeometry[3])(mgeo2), iVar1 == 4)) {
      bVar4 = false;
      pCVar2 = (ChTriangle *)mgeo2;
      pVVar3 = T1;
    }
    else {
      iVar1 = (*mgeo1->_vptr_ChGeometry[3])(mgeo1);
      if ((iVar1 != 4) || (iVar1 = (*mgeo2->_vptr_ChGeometry[3])(mgeo2), iVar1 != 1)) {
        iVar1 = (*mgeo1->_vptr_ChGeometry[3])(mgeo1);
        if ((iVar1 == 1) && (iVar1 = (*mgeo2->_vptr_ChGeometry[3])(mgeo2), iVar1 == 2)) {
          bVar4 = false;
          mgeo2_00 = (ChBox *)mgeo2;
          pVVar3 = T1;
LAB_00d7fbdc:
          iVar1 = ComputeSphereBoxCollisions
                            ((ChSphere *)mgeo1,pVVar3,mgeo2_00,R2,T2,mcollider,just_intersection,
                             bVar4);
          return iVar1;
        }
        iVar1 = (*mgeo1->_vptr_ChGeometry[3])(mgeo1);
        if ((iVar1 == 2) && (iVar1 = (*mgeo2->_vptr_ChGeometry[3])(mgeo2), iVar1 == 1)) {
          bVar4 = true;
          R2 = R1;
          mgeo2_00 = (ChBox *)mgeo1;
          pVVar3 = T2;
          mgeo1 = mgeo2;
          T2 = T1;
          goto LAB_00d7fbdc;
        }
        iVar1 = (*mgeo1->_vptr_ChGeometry[3])(mgeo1);
        if ((iVar1 == 2) && (iVar1 = (*mgeo2->_vptr_ChGeometry[3])(mgeo2), iVar1 == 4)) {
          bVar4 = false;
          pCVar2 = (ChTriangle *)mgeo2;
          pVVar3 = T1;
          R1_00 = R1;
        }
        else {
          iVar1 = (*mgeo1->_vptr_ChGeometry[3])(mgeo1);
          if ((iVar1 != 4) || (iVar1 = (*mgeo2->_vptr_ChGeometry[3])(mgeo2), iVar1 != 2))
          goto LAB_00d7fa64;
          bVar4 = true;
          pCVar2 = (ChTriangle *)mgeo1;
          pVVar3 = T2;
          R1_00 = R2;
          mgeo1 = mgeo2;
          R2 = R1;
          T2 = T1;
        }
        ComputeBoxTriangleCollisions((ChBox *)mgeo1,R1_00,pVVar3,pCVar2,R2,T2,mcollider,false,bVar4)
        ;
        goto LAB_00d7fa64;
      }
      bVar4 = true;
      R2 = R1;
      pCVar2 = (ChTriangle *)mgeo1;
      pVVar3 = T2;
      mgeo1 = mgeo2;
      T2 = T1;
    }
    iVar1 = ComputeSphereTriangleCollisions
                      ((ChSphere *)mgeo1,pVVar3,pCVar2,R2,T2,mcollider,false,bVar4);
  }
  return iVar1;
}

Assistant:

int ChGeometryCollider::ComputeCollisions(
    geometry::ChGeometry& mgeo1,       ///< first geometric primitive
    ChMatrix33<>* R1,                  ///< absolute rotation of first geometric primitive
    Vector* T1,                        ///< absolute position of first geometric primitive
    geometry::ChGeometry& mgeo2,       ///< second geometric primitive
    ChMatrix33<>* R2,                  ///< absolute rotation of second geometric primitive
    Vector* T2,                        ///< absolute position of second geometric primitive
    ChNarrowPhaseCollider& mcollider,  ///< reference to a collider to store contacts into
    ChMatrix33<>* relRot,              ///< relative rotation of mgeo2 respect to mgeo1, if available, for optimization
    Vector* relPos,                    ///< relative position of mgeo2 respect to mgeo1, if available, for optimization
    bool just_intersection  ///< if true, just report if intersecting (no further calculus on normal, depht, etc.)
) {
    // GetLog() << "  ChGeometryCollider::ComputeCollisions! geos:" << (int)&mgeo1 << " " << (int)&mgeo2 << "\n";

    // Dispatch all subcases of geometry-geometry pairs..

    if ((mgeo1.GetClassType() == geometry::ChGeometry::TRIANGLE) &&
        (mgeo2.GetClassType() == geometry::ChGeometry::TRIANGLE)) {
        //***TO DO***
        return 0;
    }

    if ((mgeo1.GetClassType() == geometry::ChGeometry::SPHERE) &&
        (mgeo2.GetClassType() == geometry::ChGeometry::SPHERE)) {
        geometry::ChSphere* msph1 = (geometry::ChSphere*)&mgeo1;
        geometry::ChSphere* msph2 = (geometry::ChSphere*)&mgeo2;
        return ComputeSphereSphereCollisions(*msph1, T1, *msph2, T2, mcollider, just_intersection);
    }

    if ((mgeo1.GetClassType() == geometry::ChGeometry::BOX) && (mgeo2.GetClassType() == geometry::ChGeometry::BOX)) {
        geometry::ChBox* mbox1 = (geometry::ChBox*)&mgeo1;
        geometry::ChBox* mbox2 = (geometry::ChBox*)&mgeo2;
        return ComputeBoxBoxCollisions(*mbox1, R1, T1, *mbox2, R2, T2, mcollider, just_intersection);
    }

    if ((mgeo1.GetClassType() == geometry::ChGeometry::SPHERE) &&
        (mgeo2.GetClassType() == geometry::ChGeometry::TRIANGLE)) {
        geometry::ChSphere* msph = (geometry::ChSphere*)&mgeo1;
        geometry::ChTriangle* mtri = (geometry::ChTriangle*)&mgeo2;
        return ComputeSphereTriangleCollisions(*msph, T1, *mtri, R2, T2, mcollider, just_intersection, false);
    }
    if ((mgeo1.GetClassType() == geometry::ChGeometry::TRIANGLE) &&
        (mgeo2.GetClassType() == geometry::ChGeometry::SPHERE)) {
        geometry::ChSphere* msph = (geometry::ChSphere*)&mgeo2;
        geometry::ChTriangle* mtri = (geometry::ChTriangle*)&mgeo1;
        return ComputeSphereTriangleCollisions(*msph, T2, *mtri, R1, T1, mcollider, just_intersection, true);
    }

    if ((mgeo1.GetClassType() == geometry::ChGeometry::SPHERE) && (mgeo2.GetClassType() == geometry::ChGeometry::BOX)) {
        geometry::ChSphere* msph = (geometry::ChSphere*)&mgeo1;
        geometry::ChBox* mbox = (geometry::ChBox*)&mgeo2;
        return ComputeSphereBoxCollisions(*msph, T1, *mbox, R2, T2, mcollider, just_intersection, false);
    }
    if ((mgeo1.GetClassType() == geometry::ChGeometry::BOX) && (mgeo2.GetClassType() == geometry::ChGeometry::SPHERE)) {
        geometry::ChSphere* msph = (geometry::ChSphere*)&mgeo2;
        geometry::ChBox* mbox = (geometry::ChBox*)&mgeo1;
        return ComputeSphereBoxCollisions(*msph, T2, *mbox, R1, T1, mcollider, just_intersection, true);
    }

    if ((mgeo1.GetClassType() == geometry::ChGeometry::BOX) &&
        (mgeo2.GetClassType() == geometry::ChGeometry::TRIANGLE)) {
        geometry::ChBox* mbox = (geometry::ChBox*)&mgeo1;
        geometry::ChTriangle* mtri = (geometry::ChTriangle*)&mgeo2;
        return ComputeBoxTriangleCollisions(*mbox, R1, T1, *mtri, R2, T2, mcollider, just_intersection, false);
    }
    if ((mgeo1.GetClassType() == geometry::ChGeometry::TRIANGLE) &&
        (mgeo2.GetClassType() == geometry::ChGeometry::BOX)) {
        geometry::ChBox* mbox = (geometry::ChBox*)&mgeo2;
        geometry::ChTriangle* mtri = (geometry::ChTriangle*)&mgeo1;
        return ComputeBoxTriangleCollisions(*mbox, R2, T2, *mtri, R1, T1, mcollider, just_intersection, true);
    }

    // default: this collision pair is not supported
    return 0;
}